

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(TimeInMillis ms)

{
  bool bVar1;
  string *in_RDI;
  tm time_struct;
  tm *in_stack_fffffffffffffd78;
  int value;
  char *in_stack_fffffffffffffd80;
  string *__lhs;
  string local_268 [16];
  int *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [36];
  int local_1c4;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [55];
  allocator<char> local_49 [21];
  int local_34;
  
  __lhs = in_RDI;
  bVar1 = PortableLocaltime((time_t)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  if (bVar1) {
    local_1c4 = local_34 + 0x76c;
    value = (int)((ulong)local_1c0 >> 0x20);
    StreamableToString<int>(in_stack_fffffffffffffda8);
    std::operator+(__lhs,in_stack_fffffffffffffd80);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::operator+(__lhs,in_stack_fffffffffffffd80);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::operator+(__lhs,in_stack_fffffffffffffd80);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::operator+(__lhs,in_stack_fffffffffffffd80);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::operator+(__lhs,in_stack_fffffffffffffd80);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::operator+(__lhs,in_stack_fffffffffffffd80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_1c0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
               (allocator<char> *)in_stack_fffffffffffffdb0);
    std::allocator<char>::~allocator(local_49);
  }
  return in_RDI;
}

Assistant:

static std::string FormatEpochTimeInMillisAsRFC3339(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
         String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
         String::FormatIntWidth2(time_struct.tm_mday) + "T" +
         String::FormatIntWidth2(time_struct.tm_hour) + ":" +
         String::FormatIntWidth2(time_struct.tm_min) + ":" +
         String::FormatIntWidth2(time_struct.tm_sec) + "Z";
}